

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint32_t farmhashcc::Hash32WithSeed(char *s,size_t len,uint32_t seed)

{
  char *pcVar1;
  uint32_t uVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = (uint)len;
  if (len < 0x19) {
    if (len < 0xd) {
      if (len < 5) {
        uVar3 = 9;
        if (len != 0) {
          sVar4 = 0;
          do {
            pcVar1 = s + sVar4;
            sVar4 = sVar4 + 1;
            seed = seed * -0x3361d2af + (int)*pcVar1;
            uVar3 = uVar3 ^ seed;
          } while (len != sVar4);
        }
        uVar3 = (uVar8 * 0x16a88000 | uVar8 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar3;
        uVar8 = (seed * 0x16a88000 | seed * -0x3361d2af >> 0x11) * 0x1b873593 ^
                (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
        uVar8 = (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + 0xe6546b64;
      }
      else {
        iVar6 = uVar8 * 5 + *(int *)(s + (len - 4));
        uVar3 = ((*(int *)s + uVar8) * 0x16a88000 | (*(int *)s + uVar8) * -0x3361d2af >> 0x11) *
                0x1b873593 ^ uVar8 * 5 + seed;
        uVar3 = (iVar6 * 0x16a88000 | (uint)(iVar6 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
                (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
        uVar8 = ((*(int *)(s + (ulong)(uVar8 >> 3 & 1) * 4) + 9) * 0x16a88000 |
                (uint)((*(int *)(s + (ulong)(uVar8 >> 3 & 1) * 4) + 9) * -0x3361d2af) >> 0x11) *
                0x1b873593 ^ (uVar3 >> 0x13 | uVar3 << 0xd) * 5 + 0xe6546b64;
        uVar8 = (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + 0xe6546b64 ^ seed;
      }
      uVar8 = uVar8 >> 0x10 ^ uVar8;
    }
    else {
      iVar6 = *(int *)(s + (len - 8));
      uVar3 = seed * -0x3361d2af ^ *(uint *)(s + 4);
      uVar5 = (*(uint *)(s + ((len >> 1) - 4)) >> 0xc | *(uint *)(s + ((len >> 1) - 4)) << 0x14) +
              *(int *)(s + (len - 4));
      uVar8 = (iVar6 * 0x16a88000 | (uint)(iVar6 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              uVar8 + seed * -0x3361d2af + *(int *)(s + (len >> 1)) * -0x3361d2af;
      iVar6 = (uVar5 >> 3 | uVar5 * 0x20000000) + iVar6;
      uVar7 = iVar6 + *(int *)(s + (len - 4));
      uVar8 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + uVar5 + 0xe6546b64;
      uVar8 = (uVar3 * 0x16a88000 | uVar3 * -0x3361d2af >> 0x11) * 0x1b873593 ^
              (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + iVar6 + -0x19ab949c;
      uVar8 = (uVar7 >> 0xc | uVar7 * 0x100000) + *(int *)(s + (len >> 1)) + -0x19ab949c +
              (uVar8 >> 0x13 | uVar8 << 0xd) * 5;
      uVar8 = uVar8 >> 0x10 ^ uVar8;
    }
    uVar8 = (uVar8 * -0x7a143595 >> 0xd ^ uVar8 * -0x7a143595) * -0x3d4d51cb;
    uVar8 = uVar8 >> 0x10 ^ uVar8;
  }
  else {
    iVar6 = *(int *)(s + 0x10);
    uVar5 = (*(uint *)(s + 8) >> 0xc | *(uint *)(s + 8) << 0x14) + *(int *)(s + 0x14);
    uVar3 = uVar8 ^ seed ^ *(uint *)(s + 4);
    uVar8 = (iVar6 * 0x16a88000 | (uint)(iVar6 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar8 ^ seed) + 0x18 + *(int *)(s + 0xc) * -0x3361d2af;
    iVar6 = (uVar5 >> 3 | uVar5 * 0x20000000) + iVar6;
    uVar7 = iVar6 + *(int *)(s + 0x14);
    uVar8 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + uVar5 + 0xe6546b64;
    uVar8 = (uVar3 * 0x16a88000 | uVar3 * -0x3361d2af >> 0x11) * 0x1b873593 ^
            (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + iVar6 + -0x19ab949c;
    uVar8 = (uVar7 >> 0xc | uVar7 * 0x100000) + *(int *)(s + 0xc) + -0x19ab949c +
            (uVar8 >> 0x13 | uVar8 << 0xd) * 5;
    uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
    uVar3 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
    uVar2 = Hash32(s + 0x18,len - 0x18);
    uVar8 = ((uVar2 + seed) * 0x16a88000 | (uVar2 + seed) * -0x3361d2af >> 0x11) * 0x1b873593 ^
            uVar3;
    uVar8 = (uVar8 >> 0x13 | (uVar8 ^ uVar3 >> 0x10) << 0xd) * 5 + 0xe6546b64;
  }
  return uVar8;
}

Assistant:

uint32_t Hash32WithSeed(const char *s, size_t len, uint32_t seed) {
  if (len <= 24) {
    if (len >= 13) return farmhashmk::Hash32Len13to24(s, len, seed * c1);
    else if (len >= 5) return farmhashmk::Hash32Len5to12(s, len, seed);
    else return farmhashmk::Hash32Len0to4(s, len, seed);
  }
  uint32_t h = farmhashmk::Hash32Len13to24(s, 24, seed ^ len);
  return Mur(Hash32(s + 24, len - 24) + seed, h);
}